

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::BitwiseOrExp(SQParser *this)

{
  SQParser *in_RDI;
  Expr *lhs;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff98;
  Expr *in_stack_ffffffffffffffd0;
  SQParser *in_stack_ffffffffffffffe0;
  SQParser *this_00;
  Expr *local_8;
  
  this_00 = in_RDI;
  NestingChecker::NestingChecker((NestingChecker *)in_RDI,in_stack_ffffffffffffff98);
  local_8 = BitwiseXorExp(this_00);
  NestingChecker::inc((NestingChecker *)in_RDI);
  if (in_RDI->_token == 0x7c) {
    local_8 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                        (this_00,(offset_in_SQParser_to_subr)in_stack_ffffffffffffffe0,
                         (TreeOp)((ulong)local_8 >> 0x20),in_stack_ffffffffffffffd0);
  }
  NestingChecker::~NestingChecker((NestingChecker *)&stack0xffffffffffffffe0);
  return local_8;
}

Assistant:

Expr* SQParser::BitwiseOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = BitwiseXorExp();
    for (;;) {
        nc.inc();
        if (_token == _SC('|')) {
            return BIN_EXP(&SQParser::BitwiseOrExp, TO_OR, lhs);
        }
        else return lhs;
    }
}